

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cimgui.cpp
# Opt level: O2

void ImVector_ImFontPtr_resizeT(ImVector_ImFontPtr *self,int new_size,ImFont *v)

{
  ImFont *local_8;
  
  local_8 = v;
  ImVector<ImFont_*>::resize(self,new_size,&local_8);
  return;
}

Assistant:

CIMGUI_API void ImVector_ImFontPtr_resizeT(ImVector_ImFontPtr* self,int new_size,ImFont* const  v)
{
    return self->resize(new_size,v);
}